

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeIncStackPos(AsyncifyBuilder *this,int32_t by)

{
  Type *this_00;
  uint bytes;
  uint align;
  BinaryOp op;
  GlobalGet *ptr;
  Expression *pEVar1;
  Const *right;
  Binary *value;
  Store *pSVar2;
  Name name;
  undefined1 local_68 [8];
  Literal literal;
  
  if (by != 0) {
    this_00 = &this->pointerType;
    Literal::makeFromInt64((Literal *)local_68,(long)by,(Type)(this->pointerType).id);
    bytes = wasm::Type::getByteSize(this_00);
    align = wasm::Type::getByteSize(this_00);
    name.super_IString.str._M_str = DAT_01175718;
    name.super_IString.str._M_len = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
    ptr = Builder::makeGlobalGet(&this->super_Builder,name,(Type)(this->pointerType).id);
    op = Abstract::getBinary((Type)this_00->id,Add);
    pEVar1 = makeGetStackPos(this);
    Literal::Literal((Literal *)&literal.type,(Literal *)local_68);
    right = Builder::makeConst(&this->super_Builder,(Literal *)&literal.type);
    value = Builder::makeBinary(&this->super_Builder,op,pEVar1,(Expression *)right);
    pSVar2 = Builder::makeStore(&this->super_Builder,bytes,(Address)0x0,align,(Expression *)ptr,
                                (Expression *)value,(Type)(this->pointerType).id,
                                (Name)(this->asyncifyMemory).super_IString.str);
    Literal::~Literal((Literal *)&literal.type);
    Literal::~Literal((Literal *)local_68);
    return (Expression *)pSVar2;
  }
  pEVar1 = (Expression *)Builder::makeNop(&this->super_Builder);
  return pEVar1;
}

Assistant:

Expression* makeIncStackPos(int32_t by) {
    if (by == 0) {
      return makeNop();
    }
    auto literal = Literal::makeFromInt64(by, pointerType);
    return makeStore(pointerType.getByteSize(),
                     int(DataOffset::BStackPos),
                     pointerType.getByteSize(),
                     makeGlobalGet(ASYNCIFY_DATA, pointerType),
                     makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                                makeGetStackPos(),
                                makeConst(literal)),
                     pointerType,
                     asyncifyMemory);
  }